

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O0

void __thiscall gdsTEXT::gdsTEXT(gdsTEXT *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  gdsTEXT *local_10;
  gdsTEXT *this_local;
  
  this->plex = 0;
  local_10 = this;
  std::bitset<16UL>::bitset(&this->presentation_flags);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->textbody,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->layer = 0;
  this->text_type = 0;
  this->path_type = 0;
  this->width = 0;
  std::bitset<16UL>::bitset(&this->text_transformation_flags);
  this->scale = 1.0;
  this->angle = 0.0;
  this->xCor = 0;
  this->yCor = 0;
  this->propattr = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->propvalue,"",local_25);
  std::allocator<char>::~allocator(local_25);
  return;
}

Assistant:

gdsTEXT(){}